

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_surface.hpp
# Opt level: O2

void __thiscall
sisl::utility::isosurface::cache_vertex
          (isosurface *this,
          map<int,_sisl::vertex3,_std::less<int>,_std::allocator<std::pair<const_int,_sisl::vertex3>_>_>
          *vMap,int *vIndex,vertex3 *v1,vertex3 *v2,double *iVal1,double *iVal2,double *isoValue,
          double *ss,function *f,bool approximate_gradient)

{
  iterator iVar1;
  ulong uVar2;
  double dVar3;
  vector local_100;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_f0;
  double local_c8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_c0;
  double local_98;
  undefined1 local_90 [96];
  
  iVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_sisl::vertex3>,_std::_Select1st<std::pair<const_int,_sisl::vertex3>_>,_std::less<int>,_std::allocator<std::pair<const_int,_sisl::vertex3>_>_>
          ::find(&vMap->_M_t,vIndex);
  if ((_Rb_tree_header *)iVar1._M_node == &(vMap->_M_t)._M_impl.super__Rb_tree_header) {
    dVar3 = *iVal2 - *iVal1;
    uVar2 = -(ulong)(ABS(dVar3) < 0.0001);
    local_98 = (double)(uVar2 & 0x3fe0000000000000 | ~uVar2 & (ulong)((*isoValue - *iVal1) / dVar3))
    ;
    local_c8 = 1.0 - local_98;
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
              (&local_c0,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)v1,&local_c8);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
              (&local_f0,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)v2,&local_98);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                 *)local_90,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                 *)&local_c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                 *)&local_f0);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_100,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>
                *)local_90);
    local_90._0_4_ = 3;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&local_f0,(int *)local_90);
    vertex3::vertex3((vertex3 *)&local_c0,&local_100,(vector *)&local_f0);
    std::pair<const_int,_sisl::vertex3>::pair<sisl::vertex3,_true>
              ((pair<const_int,_sisl::vertex3> *)local_90,vIndex,(vertex3 *)&local_c0);
    std::
    _Rb_tree<int,std::pair<int_const,sisl::vertex3>,std::_Select1st<std::pair<int_const,sisl::vertex3>>,std::less<int>,std::allocator<std::pair<int_const,sisl::vertex3>>>
    ::_M_insert_unique<std::pair<int_const,sisl::vertex3>>
              ((_Rb_tree<int,std::pair<int_const,sisl::vertex3>,std::_Select1st<std::pair<int_const,sisl::vertex3>>,std::less<int>,std::allocator<std::pair<int_const,sisl::vertex3>>>
                *)vMap,(pair<const_int,_sisl::vertex3> *)local_90);
    vertex3::~vertex3((vertex3 *)(local_90 + 8));
    vertex3::~vertex3((vertex3 *)&local_c0);
    free(local_f0.m_lhs);
    free(local_100.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  }
  return;
}

Assistant:

inline void cache_vertex(
                    std::map<int, sisl::vertex3 > *vMap,
                    const int &vIndex,
                    const vertex3 &v1,
                    const vertex3 &v2,
                    const double &iVal1,
                    const double &iVal2,
                    const double &isoValue,
                    const double &ss,
                    sisl::function *f,
                    bool approximate_gradient = false) {

                #pragma omp critical(cache_vertex)
                {
                    if(vMap->find(vIndex) == vMap->end()) {
                        double interpolate = (isoValue -iVal1)/(iVal2-iVal1);
                        if(fabs(iVal2-iVal1) < 0.0001)
                            interpolate = 0.5;
                        sisl::vector vnew = v1.p*(1.-interpolate) + v2.p*(interpolate);
                        sisl::vector na(3);// = f->grad(vnew);

                        vMap->insert(
                            {
                                vIndex,
                                sisl::vertex3(vnew, na)
                            });
                    }
                }
            }